

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListVarAddLiteral(Fxu_Var *pVar,Fxu_Lit *pLink)

{
  Fxu_ListLit *pList;
  Fxu_Lit *pLink_local;
  Fxu_Var *pVar_local;
  
  if ((pVar->lLits).pHead == (Fxu_Lit *)0x0) {
    (pVar->lLits).pHead = pLink;
    (pVar->lLits).pTail = pLink;
    pLink->pVPrev = (Fxu_Lit *)0x0;
    pLink->pVNext = (Fxu_Lit *)0x0;
  }
  else {
    pLink->pVNext = (Fxu_Lit *)0x0;
    ((pVar->lLits).pTail)->pVNext = pLink;
    pLink->pVPrev = (pVar->lLits).pTail;
    (pVar->lLits).pTail = pLink;
  }
  (pVar->lLits).nItems = (pVar->lLits).nItems + 1;
  return;
}

Assistant:

void Fxu_ListVarAddLiteral( Fxu_Var * pVar, Fxu_Lit * pLink )
{
    Fxu_ListLit * pList = &(pVar->lLits);
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pVPrev = NULL;
        pLink->pVNext = NULL;
    }
    else
    {
        pLink->pVNext = NULL;
        pList->pTail->pVNext = pLink;
        pLink->pVPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}